

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O1

void coins_tests::CheckWriteCoins
               (CAmount parent_value,CAmount child_value,CAmount expected_value,char parent_flags,
               char child_flags,char expected_flags)

{
  long lVar1;
  undefined7 in_register_00000081;
  iterator pvVar2;
  undefined7 in_register_00000089;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  lazy_ostream local_4a8;
  undefined1 *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char result_flags;
  CAmount result_value;
  char expected_flags_local;
  CAmount expected_value_local;
  CAmount *local_448;
  undefined **local_440;
  undefined1 local_438;
  undefined1 *local_430;
  CAmount **local_428;
  CAmount *local_420;
  undefined **local_418;
  undefined1 local_410;
  undefined1 *local_408;
  CAmount **local_400;
  char *local_3f8;
  char *local_3f0;
  assertion_result local_3e8;
  SingleEntryCacheTest test;
  
  pvVar3 = (iterator)CONCAT71(in_register_00000089,expected_flags);
  pvVar2 = (iterator)CONCAT71(in_register_00000081,child_flags);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  expected_flags_local = expected_flags;
  expected_value_local = expected_value;
  SingleEntryCacheTest::SingleEntryCacheTest(&test,-2,parent_value,parent_flags);
  WriteCoinsViewEntry((CCoinsView *)&test.cache,child_value,child_flags);
  anon_unknown.dwarf_6976df::CCoinsViewCacheTest::SelfTest(&test.cache,false);
  GetCoinsMapEntry(&test.cache.super_CCoinsViewCache.cacheCoins,&result_value,&result_flags,
                   (COutPoint *)OUTPOINT);
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x33d;
  file.m_begin = (iterator)&local_478;
  msg.m_end = pvVar3;
  msg.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_488,msg);
  local_4a8.m_empty = false;
  local_4a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_498 = boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_420 = &result_value;
  local_448 = &expected_value_local;
  local_3e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result_value == expected_value_local);
  local_3e8.m_message.px = (element_type *)0x0;
  local_3e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_3f0 = "";
  local_410 = 0;
  local_418 = &PTR__lazy_ostream_013abed0;
  local_408 = boost::unit_test::lazy_ostream::inst;
  local_438 = 0;
  local_440 = &PTR__lazy_ostream_013abed0;
  local_430 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_428 = &local_448;
  local_400 = &local_420;
  boost::test_tools::tt_detail::report_assertion
            (&local_3e8,&local_4a8,1,2,REQUIRE,0xe6cd55,(size_t)&local_3f8,0x33d,&local_418,
             "expected_value",&local_440);
  boost::detail::shared_count::~shared_count(&local_3e8.m_message.pn);
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x33e;
  file_00.m_begin = (iterator)&local_4b8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4c8,
             msg_00);
  local_4a8.m_empty = false;
  local_4a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_498 = boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  local_420 = (CAmount *)&result_flags;
  local_448 = (CAmount *)&expected_flags_local;
  local_3e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(result_flags == expected_flags_local);
  local_3e8.m_message.px = (element_type *)0x0;
  local_3e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_3f0 = "";
  local_410 = 0;
  local_418 = &PTR__lazy_ostream_013ad180;
  local_408 = boost::unit_test::lazy_ostream::inst;
  local_438 = 0;
  local_440 = &PTR__lazy_ostream_013ad180;
  local_430 = boost::unit_test::lazy_ostream::inst;
  local_428 = &local_448;
  local_400 = &local_420;
  boost::test_tools::tt_detail::report_assertion
            (&local_3e8,&local_4a8,1,2,REQUIRE,0xe6cd71,(size_t)&local_3f8,0x33e,&local_418,
             "expected_flags",&local_440);
  boost::detail::shared_count::~shared_count(&local_3e8.m_message.pn);
  test.cache.super_CCoinsViewCache.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_013bb490;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&test.cache.super_CCoinsViewCache.cacheCoins._M_h);
  if (test.cache.super_CCoinsViewCache.m_sentinel.second.m_flags != '\0') {
    ((test.cache.super_CCoinsViewCache.m_sentinel.second.m_next)->second).m_prev =
         test.cache.super_CCoinsViewCache.m_sentinel.second.m_prev;
    ((test.cache.super_CCoinsViewCache.m_sentinel.second.m_prev)->second).m_next =
         test.cache.super_CCoinsViewCache.m_sentinel.second.m_next;
    test.cache.super_CCoinsViewCache.m_sentinel.second.m_flags = '\0';
  }
  if (0x1c < test.cache.super_CCoinsViewCache.m_sentinel.second.coin.out.scriptPubKey.
             super_CScriptBase._size) {
    free(test.cache.super_CCoinsViewCache.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase.
         _union.indirect_contents.indirect);
    test.cache.super_CCoinsViewCache.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase.
    _union.indirect_contents.indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource
            (&test.cache.super_CCoinsViewCache.m_cache_coins_memory_resource);
  test.base.super_CCoinsViewCache.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_013bb490;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&test.base.super_CCoinsViewCache.cacheCoins._M_h);
  if (test.base.super_CCoinsViewCache.m_sentinel.second.m_flags != '\0') {
    ((test.base.super_CCoinsViewCache.m_sentinel.second.m_next)->second).m_prev =
         test.base.super_CCoinsViewCache.m_sentinel.second.m_prev;
    ((test.base.super_CCoinsViewCache.m_sentinel.second.m_prev)->second).m_next =
         test.base.super_CCoinsViewCache.m_sentinel.second.m_next;
    test.base.super_CCoinsViewCache.m_sentinel.second.m_flags = '\0';
  }
  if (0x1c < test.base.super_CCoinsViewCache.m_sentinel.second.coin.out.scriptPubKey.
             super_CScriptBase._size) {
    free(test.base.super_CCoinsViewCache.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase.
         _union.indirect_contents.indirect);
    test.base.super_CCoinsViewCache.m_sentinel.second.coin.out.scriptPubKey.super_CScriptBase._union
    .indirect_contents.indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource
            (&test.base.super_CCoinsViewCache.m_cache_coins_memory_resource);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckWriteCoins(CAmount parent_value, CAmount child_value, CAmount expected_value, char parent_flags, char child_flags, char expected_flags)
{
    SingleEntryCacheTest test(ABSENT, parent_value, parent_flags);

    CAmount result_value;
    char result_flags;
    try {
        WriteCoinsViewEntry(test.cache, child_value, child_flags);
        test.cache.SelfTest(/*sanity_check=*/false);
        GetCoinsMapEntry(test.cache.map(), result_value, result_flags);
    } catch (std::logic_error&) {
        result_value = FAIL;
        result_flags = NO_ENTRY;
    }

    BOOST_CHECK_EQUAL(result_value, expected_value);
    BOOST_CHECK_EQUAL(result_flags, expected_flags);
}